

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::get_complexity_per_elem(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  Reals *pRVar1;
  LO nmetrics;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar3;
  Reals RVar4;
  Read<double> local_e8;
  Read<double> local_d8;
  Read<double> local_c8;
  Read<double> local_b8;
  Read<double> local_a8;
  Read<double> local_98;
  int local_88;
  Int metric_dim;
  allocator local_71;
  string local_70 [32];
  initializer_list<double> local_50;
  Reals *local_40;
  Reals *v2m_local;
  Mesh *mesh_local;
  Reals *local_28;
  Reals *local_20;
  Reals *local_18;
  ulong local_10;
  
  if (((ulong)(v2m->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((v2m->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(v2m->write_).shared_alloc_.alloc >> 3;
  }
  local_40 = v2m;
  v2m_local = (Reals *)mesh;
  mesh_local = (Mesh *)this;
  local_28 = v2m;
  local_20 = v2m;
  local_18 = v2m;
  if ((int)(local_10 >> 3) == 0) {
    std::initializer_list<double>::initializer_list(&local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"",&local_71);
    Read<double>::Read((Read<double> *)this,local_50,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pvVar3 = extraout_RDX;
  }
  else {
    nmetrics = Mesh::nverts(mesh);
    Read<double>::Read(&local_98,v2m);
    IVar2 = get_metrics_dim(nmetrics,&local_98);
    Read<double>::~Read(&local_98);
    local_88 = IVar2;
    IVar2 = Mesh::dim((Mesh *)v2m_local);
    pRVar1 = v2m_local;
    if ((IVar2 == 3) && (local_88 == 3)) {
      Read<double>::Read(&local_a8,v2m);
      get_complexity_per_elem_tmpl<3,3>(this,(Mesh *)pRVar1,&local_a8);
      Read<double>::~Read(&local_a8);
      pvVar3 = extraout_RDX_00;
    }
    else {
      IVar2 = Mesh::dim((Mesh *)v2m_local);
      pRVar1 = v2m_local;
      if ((IVar2 == 2) && (local_88 == 2)) {
        Read<double>::Read(&local_b8,v2m);
        get_complexity_per_elem_tmpl<2,2>(this,(Mesh *)pRVar1,&local_b8);
        Read<double>::~Read(&local_b8);
        pvVar3 = extraout_RDX_01;
      }
      else {
        IVar2 = Mesh::dim((Mesh *)v2m_local);
        pRVar1 = v2m_local;
        if ((IVar2 == 3) && (local_88 == 1)) {
          Read<double>::Read(&local_c8,v2m);
          get_complexity_per_elem_tmpl<3,1>(this,(Mesh *)pRVar1,&local_c8);
          Read<double>::~Read(&local_c8);
          pvVar3 = extraout_RDX_02;
        }
        else {
          IVar2 = Mesh::dim((Mesh *)v2m_local);
          pRVar1 = v2m_local;
          if ((IVar2 == 2) && (local_88 == 1)) {
            Read<double>::Read(&local_d8,v2m);
            get_complexity_per_elem_tmpl<2,1>(this,(Mesh *)pRVar1,&local_d8);
            Read<double>::~Read(&local_d8);
            pvVar3 = extraout_RDX_03;
          }
          else {
            IVar2 = Mesh::dim((Mesh *)v2m_local);
            pRVar1 = v2m_local;
            if (IVar2 != 1) {
              fail("assertion %s failed at %s +%d\n","false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
                   ,0x1f2);
            }
            Read<double>::Read(&local_e8,v2m);
            get_complexity_per_elem_tmpl<1,1>(this,(Mesh *)pRVar1,&local_e8);
            Read<double>::~Read(&local_e8);
            pvVar3 = extraout_RDX_04;
          }
        }
      }
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals get_complexity_per_elem(Mesh* mesh, Reals v2m) {
  if (v2m.size() == 0) return Reals({});
  auto metric_dim = get_metrics_dim(mesh->nverts(), v2m);
  if (mesh->dim() == 3 && metric_dim == 3) {
    return get_complexity_per_elem_tmpl<3, 3>(mesh, v2m);
  } else if (mesh->dim() == 2 && metric_dim == 2) {
    return get_complexity_per_elem_tmpl<2, 2>(mesh, v2m);
  } else if (mesh->dim() == 3 && metric_dim == 1) {
    return get_complexity_per_elem_tmpl<3, 1>(mesh, v2m);
  } else if (mesh->dim() == 2 && metric_dim == 1) {
    return get_complexity_per_elem_tmpl<2, 1>(mesh, v2m);
  } else if (mesh->dim() == 1) {
    return get_complexity_per_elem_tmpl<1, 1>(mesh, v2m);
  }
  OMEGA_H_NORETURN(Reals());
}